

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

Bits __thiscall
OPL::DOSBox::DBOPL::Operator::TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)2>(Operator *this)

{
  int iVar1;
  uint uVar2;
  
  if ((this->reg20 & 0x20) != 0) {
    return this->volume;
  }
  uVar2 = this->rateIndex + this->releaseAdd;
  this->rateIndex = uVar2 & 0xffffff;
  iVar1 = (uVar2 >> 0x18) + this->volume;
  if (0x1fe < iVar1) {
    this->volume = 0x1ff;
    this->state = '\0';
    this->volHandler = (VolumeHandler)TemplateVolume<(OPL::DOSBox::DBOPL::Operator::State)0>;
    *(undefined8 *)&this->field_0x8 = 0;
    return 0x1ff;
  }
  this->volume = iVar1;
  return iVar1;
}

Assistant:

Bits Operator::TemplateVolume(  ) {
	Bit32s vol = volume;
	Bit32s change;
	switch ( yes ) {
	case OFF:
		return ENV_MAX;
	case ATTACK:
		change = RateForward( attackAdd );
		if ( !change )
			return vol;
		vol += ( (~vol) * change ) >> 3;
		if ( vol < ENV_MIN ) {
			volume = ENV_MIN;
			rateIndex = 0;
			SetState( DECAY );
			return ENV_MIN;
		}
		break;
	case DECAY:
		vol += RateForward( decayAdd );
		if ( GCC_UNLIKELY(vol >= sustainLevel) ) {
			//Check if we didn't overshoot max attenuation, then just go off
			if ( GCC_UNLIKELY(vol >= ENV_MAX) ) {
				volume = ENV_MAX;
				SetState( OFF );
				return ENV_MAX;
			}
			//Continue as sustain
			rateIndex = 0;
			SetState( SUSTAIN );
		}
		break;
	case SUSTAIN:
		if ( reg20 & MASK_SUSTAIN ) {
			return vol;
		}
		//In sustain phase, but not sustaining, do regular release
	case RELEASE:
		vol += RateForward( releaseAdd );
		if ( GCC_UNLIKELY(vol >= ENV_MAX) ) {
			volume = ENV_MAX;
			SetState( OFF );
			return ENV_MAX;
		}
		break;
	}
	volume = vol;
	return vol;
}